

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

vector<const_char_*,_std::allocator<const_char_*>_> * __thiscall
spvtools::Optimizer::GetPassNames
          (vector<const_char_*,_std::allocator<const_char_*>_> *__return_storage_ptr__,
          Optimizer *this)

{
  _Head_base<0UL,_spvtools::Optimizer::Impl_*,_false> _Var1;
  int iVar2;
  char *in_RAX;
  Pass *pPVar3;
  undefined4 extraout_var;
  uint32_t i;
  uint index;
  char *local_28;
  
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28 = in_RAX;
  for (index = 0;
      _Var1._M_head_impl =
           (this->impl_)._M_t.
           super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
           .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl,
      index < (uint)((ulong)((long)((_Var1._M_head_impl)->pass_manager).passes_.
                                   super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            *(long *)&((_Var1._M_head_impl)->pass_manager).passes_.
                                      super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
                            ) >> 3); index = index + 1) {
    pPVar3 = opt::PassManager::GetPass(&(_Var1._M_head_impl)->pass_manager,index);
    iVar2 = (*pPVar3->_vptr_Pass[2])(pPVar3);
    local_28 = (char *)CONCAT44(extraout_var,iVar2);
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const char*> Optimizer::GetPassNames() const {
  std::vector<const char*> v;
  for (uint32_t i = 0; i < impl_->pass_manager.NumPasses(); i++) {
    v.push_back(impl_->pass_manager.GetPass(i)->name());
  }
  return v;
}